

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag>::Evaluate
          (string *__return_storage_ptr__,
          TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *this_00;
  cmGeneratorTarget *pcVar3;
  string *this_01;
  GeneratorExpressionContent *content_00;
  string result;
  cmGeneratorTarget *target;
  string name;
  string local_b0;
  cmGeneratorTarget *local_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  content_00 = content;
  std::__cxx11::string::string
            ((string *)&local_48,
             (string *)
             (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  bVar1 = cmGeneratorExpression::IsValidTargetName(&local_48);
  if (bVar1) {
    this_00 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_48);
    local_90 = this_00;
    if (this_00 != (cmGeneratorTarget *)0x0) {
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if (3 < (int)TVar2) {
        TVar2 = cmGeneratorTarget::GetType(this_00);
        if (TVar2 != UNKNOWN_LIBRARY) {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b0,content);
          std::operator+(&local_68,"Target \"",&local_48);
          std::operator+(&local_88,&local_68,"\" is not an executable or library.");
          reportError(context,&local_b0,&local_88);
          goto LAB_002a62ce;
        }
      }
      if (dagChecker != (cmGeneratorExpressionDAGChecker *)0x0) {
        bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(dagChecker,this_00);
        if (bVar1) {
LAB_002a61c0:
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b0,content);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,
                     "Expressions which require the linker language may not be used while evaluating link libraries"
                     ,(allocator<char> *)&local_68);
          reportError(context,&local_b0,&local_88);
          goto LAB_002a622c;
        }
        bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagChecker);
        if (bVar1) {
          pcVar3 = cmGeneratorExpressionDAGChecker::TopTarget(dagChecker);
          if (this_00 == pcVar3) goto LAB_002a61c0;
        }
      }
      std::
      _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
      ::_M_insert_unique<cmGeneratorTarget*const&>
                ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                  *)&context->DependTargets,&local_90);
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)&context->AllTargets,&local_90);
      TargetFilesystemArtifactResultCreator<ArtifactSonameTag>::Create_abi_cxx11_
                (&local_b0,(TargetFilesystemArtifactResultCreator<ArtifactSonameTag> *)local_90,
                 (cmGeneratorTarget *)context,(cmGeneratorExpressionContext *)content,content_00);
      if (context->HadError == true) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_b0);
      }
      std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_002a62fc;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b0,content);
    std::operator+(&local_68,"No target \"",&local_48);
    std::operator+(&local_88,&local_68,"\"");
    reportError(context,&local_b0,&local_88);
LAB_002a62ce:
    std::__cxx11::string::~string((string *)&local_88);
    this_01 = &local_68;
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b0,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Expression syntax not recognized.",(allocator<char> *)&local_68)
    ;
    reportError(context,&local_b0,&local_88);
LAB_002a622c:
    this_01 = &local_88;
  }
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::~string((string *)&local_b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_002a62fc:
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    // Lookup the referenced target.
    std::string name = parameters.front();

    if (!cmGeneratorExpression::IsValidTargetName(name)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
      return std::string();
    }
    cmGeneratorTarget* target = context->LG->FindGeneratorTargetToUse(name);
    if (!target) {
      ::reportError(context, content->GetOriginalExpression(),
                    "No target \"" + name + "\"");
      return std::string();
    }
    if (target->GetType() >= cmStateEnums::OBJECT_LIBRARY &&
        target->GetType() != cmStateEnums::UNKNOWN_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Target \"" + name +
                      "\" is not an executable or library.");
      return std::string();
    }
    if (dagChecker &&
        (dagChecker->EvaluatingLinkLibraries(target) ||
         (dagChecker->EvaluatingSources() &&
          target == dagChecker->TopTarget()))) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expressions which require the linker language may not "
                    "be used while evaluating link libraries");
      return std::string();
    }
    context->DependTargets.insert(target);
    context->AllTargets.insert(target);

    std::string result =
      TargetFilesystemArtifactResultCreator<ArtifactT>::Create(target, context,
                                                               content);
    if (context->HadError) {
      return std::string();
    }
    return TargetFilesystemArtifactResultGetter<ComponentT>::Get(result);
  }